

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O0

void __thiscall
FPNGTexture::FPNGTexture
          (FPNGTexture *this,FileReader *lump,int lumpnum,FString *filename,int width,int height,
          BYTE depth,BYTE colortype,BYTE interlace)

{
  int iVar1;
  char *pcVar2;
  BYTE *pBVar3;
  uint local_564;
  uint local_560;
  int ihoty;
  int ihotx;
  DWORD hoty;
  DWORD hotx;
  int i;
  DWORD id;
  DWORD len;
  BYTE trans [256];
  undefined4 local_43c;
  anon_union_1024_2_8a3eb4f6 p;
  int local_30;
  int local_2c;
  int height_local;
  int width_local;
  FString *filename_local;
  FileReader *pFStack_18;
  int lumpnum_local;
  FileReader *lump_local;
  FPNGTexture *this_local;
  
  local_30 = height;
  local_2c = width;
  _height_local = filename;
  filename_local._4_4_ = lumpnum;
  pFStack_18 = lump;
  lump_local = (FileReader *)this;
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPNGTexture_00b87fb0;
  FString::FString(&this->SourceFile,_height_local);
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->BitDepth = depth;
  this->ColorType = colortype;
  this->Interlace = interlace;
  this->HaveTrans = false;
  this->PaletteMap = (BYTE *)0x0;
  this->PaletteSize = 0;
  this->StartOfIDAT = 0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  (this->super_FTexture).field_0x31 = (this->super_FTexture).field_0x31 & 0xf7;
  (this->super_FTexture).Width = (WORD)local_2c;
  (this->super_FTexture).Height = (WORD)local_30;
  FTexture::CalcBitSize(&this->super_FTexture);
  trans[0xe8] = 0xff;
  trans[0xe9] = 0xff;
  trans[0xea] = 0xff;
  trans[0xeb] = 0xff;
  trans[0xec] = 0xff;
  trans[0xed] = 0xff;
  trans[0xee] = 0xff;
  trans[0xef] = 0xff;
  trans[0xf0] = 0xff;
  trans[0xf1] = 0xff;
  trans[0xf2] = 0xff;
  trans[0xf3] = 0xff;
  trans[0xf4] = 0xff;
  trans[0xf5] = 0xff;
  trans[0xf6] = 0xff;
  trans[0xf7] = 0xff;
  trans[0xd8] = 0xff;
  trans[0xd9] = 0xff;
  trans[0xda] = 0xff;
  trans[0xdb] = 0xff;
  trans[0xdc] = 0xff;
  trans[0xdd] = 0xff;
  trans[0xde] = 0xff;
  trans[0xdf] = 0xff;
  trans[0xe0] = 0xff;
  trans[0xe1] = 0xff;
  trans[0xe2] = 0xff;
  trans[0xe3] = 0xff;
  trans[0xe4] = 0xff;
  trans[0xe5] = 0xff;
  trans[0xe6] = 0xff;
  trans[0xe7] = 0xff;
  trans[200] = 0xff;
  trans[0xc9] = 0xff;
  trans[0xca] = 0xff;
  trans[0xcb] = 0xff;
  trans[0xcc] = 0xff;
  trans[0xcd] = 0xff;
  trans[0xce] = 0xff;
  trans[0xcf] = 0xff;
  trans[0xd0] = 0xff;
  trans[0xd1] = 0xff;
  trans[0xd2] = 0xff;
  trans[0xd3] = 0xff;
  trans[0xd4] = 0xff;
  trans[0xd5] = 0xff;
  trans[0xd6] = 0xff;
  trans[0xd7] = 0xff;
  trans[0xb8] = 0xff;
  trans[0xb9] = 0xff;
  trans[0xba] = 0xff;
  trans[0xbb] = 0xff;
  trans[0xbc] = 0xff;
  trans[0xbd] = 0xff;
  trans[0xbe] = 0xff;
  trans[0xbf] = 0xff;
  trans[0xc0] = 0xff;
  trans[0xc1] = 0xff;
  trans[0xc2] = 0xff;
  trans[0xc3] = 0xff;
  trans[0xc4] = 0xff;
  trans[0xc5] = 0xff;
  trans[0xc6] = 0xff;
  trans[199] = 0xff;
  trans[0xa8] = 0xff;
  trans[0xa9] = 0xff;
  trans[0xaa] = 0xff;
  trans[0xab] = 0xff;
  trans[0xac] = 0xff;
  trans[0xad] = 0xff;
  trans[0xae] = 0xff;
  trans[0xaf] = 0xff;
  trans[0xb0] = 0xff;
  trans[0xb1] = 0xff;
  trans[0xb2] = 0xff;
  trans[0xb3] = 0xff;
  trans[0xb4] = 0xff;
  trans[0xb5] = 0xff;
  trans[0xb6] = 0xff;
  trans[0xb7] = 0xff;
  trans[0x98] = 0xff;
  trans[0x99] = 0xff;
  trans[0x9a] = 0xff;
  trans[0x9b] = 0xff;
  trans[0x9c] = 0xff;
  trans[0x9d] = 0xff;
  trans[0x9e] = 0xff;
  trans[0x9f] = 0xff;
  trans[0xa0] = 0xff;
  trans[0xa1] = 0xff;
  trans[0xa2] = 0xff;
  trans[0xa3] = 0xff;
  trans[0xa4] = 0xff;
  trans[0xa5] = 0xff;
  trans[0xa6] = 0xff;
  trans[0xa7] = 0xff;
  trans[0x88] = 0xff;
  trans[0x89] = 0xff;
  trans[0x8a] = 0xff;
  trans[0x8b] = 0xff;
  trans[0x8c] = 0xff;
  trans[0x8d] = 0xff;
  trans[0x8e] = 0xff;
  trans[0x8f] = 0xff;
  trans[0x90] = 0xff;
  trans[0x91] = 0xff;
  trans[0x92] = 0xff;
  trans[0x93] = 0xff;
  trans[0x94] = 0xff;
  trans[0x95] = 0xff;
  trans[0x96] = 0xff;
  trans[0x97] = 0xff;
  trans[0x78] = 0xff;
  trans[0x79] = 0xff;
  trans[0x7a] = 0xff;
  trans[0x7b] = 0xff;
  trans[0x7c] = 0xff;
  trans[0x7d] = 0xff;
  trans[0x7e] = 0xff;
  trans[0x7f] = 0xff;
  trans[0x80] = 0xff;
  trans[0x81] = 0xff;
  trans[0x82] = 0xff;
  trans[0x83] = 0xff;
  trans[0x84] = 0xff;
  trans[0x85] = 0xff;
  trans[0x86] = 0xff;
  trans[0x87] = 0xff;
  trans[0x68] = 0xff;
  trans[0x69] = 0xff;
  trans[0x6a] = 0xff;
  trans[0x6b] = 0xff;
  trans[0x6c] = 0xff;
  trans[0x6d] = 0xff;
  trans[0x6e] = 0xff;
  trans[0x6f] = 0xff;
  trans[0x70] = 0xff;
  trans[0x71] = 0xff;
  trans[0x72] = 0xff;
  trans[0x73] = 0xff;
  trans[0x74] = 0xff;
  trans[0x75] = 0xff;
  trans[0x76] = 0xff;
  trans[0x77] = 0xff;
  trans[0x58] = 0xff;
  trans[0x59] = 0xff;
  trans[0x5a] = 0xff;
  trans[0x5b] = 0xff;
  trans[0x5c] = 0xff;
  trans[0x5d] = 0xff;
  trans[0x5e] = 0xff;
  trans[0x5f] = 0xff;
  trans[0x60] = 0xff;
  trans[0x61] = 0xff;
  trans[0x62] = 0xff;
  trans[99] = 0xff;
  trans[100] = 0xff;
  trans[0x65] = 0xff;
  trans[0x66] = 0xff;
  trans[0x67] = 0xff;
  trans[0x48] = 0xff;
  trans[0x49] = 0xff;
  trans[0x4a] = 0xff;
  trans[0x4b] = 0xff;
  trans[0x4c] = 0xff;
  trans[0x4d] = 0xff;
  trans[0x4e] = 0xff;
  trans[0x4f] = 0xff;
  trans[0x50] = 0xff;
  trans[0x51] = 0xff;
  trans[0x52] = 0xff;
  trans[0x53] = 0xff;
  trans[0x54] = 0xff;
  trans[0x55] = 0xff;
  trans[0x56] = 0xff;
  trans[0x57] = 0xff;
  trans[0x38] = 0xff;
  trans[0x39] = 0xff;
  trans[0x3a] = 0xff;
  trans[0x3b] = 0xff;
  trans[0x3c] = 0xff;
  trans[0x3d] = 0xff;
  trans[0x3e] = 0xff;
  trans[0x3f] = 0xff;
  trans[0x40] = 0xff;
  trans[0x41] = 0xff;
  trans[0x42] = 0xff;
  trans[0x43] = 0xff;
  trans[0x44] = 0xff;
  trans[0x45] = 0xff;
  trans[0x46] = 0xff;
  trans[0x47] = 0xff;
  trans[0x28] = 0xff;
  trans[0x29] = 0xff;
  trans[0x2a] = 0xff;
  trans[0x2b] = 0xff;
  trans[0x2c] = 0xff;
  trans[0x2d] = 0xff;
  trans[0x2e] = 0xff;
  trans[0x2f] = 0xff;
  trans[0x30] = 0xff;
  trans[0x31] = 0xff;
  trans[0x32] = 0xff;
  trans[0x33] = 0xff;
  trans[0x34] = 0xff;
  trans[0x35] = 0xff;
  trans[0x36] = 0xff;
  trans[0x37] = 0xff;
  trans[0x18] = 0xff;
  trans[0x19] = 0xff;
  trans[0x1a] = 0xff;
  trans[0x1b] = 0xff;
  trans[0x1c] = 0xff;
  trans[0x1d] = 0xff;
  trans[0x1e] = 0xff;
  trans[0x1f] = 0xff;
  trans[0x20] = 0xff;
  trans[0x21] = 0xff;
  trans[0x22] = 0xff;
  trans[0x23] = 0xff;
  trans[0x24] = 0xff;
  trans[0x25] = 0xff;
  trans[0x26] = 0xff;
  trans[0x27] = 0xff;
  trans[8] = 0xff;
  trans[9] = 0xff;
  trans[10] = 0xff;
  trans[0xb] = 0xff;
  trans[0xc] = 0xff;
  trans[0xd] = 0xff;
  trans[0xe] = 0xff;
  trans[0xf] = 0xff;
  trans[0x10] = 0xff;
  trans[0x11] = 0xff;
  trans[0x12] = 0xff;
  trans[0x13] = 0xff;
  trans[0x14] = 0xff;
  trans[0x15] = 0xff;
  trans[0x16] = 0xff;
  trans[0x17] = 0xff;
  id = 0xffffffff;
  len = 0xffffffff;
  trans[0] = 0xff;
  trans[1] = 0xff;
  trans[2] = 0xff;
  trans[3] = 0xff;
  trans[4] = 0xff;
  trans[5] = 0xff;
  trans[6] = 0xff;
  trans[7] = 0xff;
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,0x21,0);
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&i,4);
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&hotx,4);
  while (hotx != 0x54414449 && hotx != 0x444e4549) {
    i = BigLong(i);
    if (hotx == 0x45544c50) {
      iVar1 = MIN<int>((uint)i / 3,0x100);
      this->PaletteSize = iVar1;
      (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])
                (pFStack_18,&local_43c,(long)(this->PaletteSize * 3));
      if (this->PaletteSize * 3 != i) {
        (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])
                  (pFStack_18,(ulong)(uint)(i + this->PaletteSize * -3),1);
      }
      hoty = this->PaletteSize;
      while (hoty = hoty - 1, -1 < (int)hoty) {
        (&local_43c)[(int)hoty] =
             (uint)*(byte *)((long)&local_43c + (long)(int)hoty * 3) << 0x10 |
             (uint)*(byte *)((long)&local_43c + (long)(int)hoty * 3 + 1) << 8 |
             (uint)*(byte *)((long)&local_43c + (long)(int)hoty * 3 + 2);
      }
    }
    else if (hotx == 0x534e5274) {
      (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&id,(ulong)(uint)i);
      this->HaveTrans = true;
      this->NonPaletteTrans[0] = (ushort)(byte)id * 0x100 + (ushort)id._1_1_;
      this->NonPaletteTrans[1] = (ushort)id._2_1_ * 0x100 + (ushort)id._3_1_;
      this->NonPaletteTrans[2] = (ushort)(byte)len * 0x100 + (ushort)len._1_1_;
    }
    else if (hotx == 0x62417267) {
      (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&ihotx,4);
      (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&ihoty,4);
      local_560 = BigLong(ihotx);
      local_564 = BigLong(ihoty);
      if (((int)local_560 < -0x8000) || (0x7fff < (int)local_560)) {
        pcVar2 = FWadCollection::GetLumpFullName(&Wads,filename_local._4_4_);
        Printf("X-Offset for PNG texture %s is bad: %d (0x%08x)\n",pcVar2,(ulong)local_560);
        local_560 = 0;
      }
      if (((int)local_564 < -0x8000) || (0x7fff < (int)local_564)) {
        pcVar2 = FWadCollection::GetLumpFullName(&Wads,filename_local._4_4_);
        Printf("Y-Offset for PNG texture %s is bad: %d (0x%08x)\n",pcVar2,(ulong)local_564);
        local_564 = 0;
      }
      (this->super_FTexture).LeftOffset = (SWORD)local_560;
      (this->super_FTexture).TopOffset = (SWORD)local_564;
    }
    else if (hotx == 0x68506c61) {
      *(ushort *)&(this->super_FTexture).field_0x31 =
           *(ushort *)&(this->super_FTexture).field_0x31 & 0xffef | 0x10;
      *(ushort *)&(this->super_FTexture).field_0x31 =
           *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | 8;
    }
    else {
      (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,(ulong)(uint)i,1);
    }
    (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,4,1);
    (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&i,4);
    hotx = 0x444e4549;
    (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&hotx,4);
  }
  iVar1 = (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[3])();
  this->StartOfIDAT = iVar1 - 8;
  switch(colortype) {
  case '\x02':
    *(ushort *)&(this->super_FTexture).field_0x31 =
         *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | (ushort)(this->HaveTrans & 1) << 3
    ;
    break;
  case '\x03':
    pBVar3 = (BYTE *)operator_new__((long)this->PaletteSize);
    this->PaletteMap = pBVar3;
    FPalette::MakeRemap(&GPalette,&local_43c,this->PaletteMap,(BYTE *)&id,this->PaletteSize);
    for (hoty = 0; (int)hoty < this->PaletteSize; hoty = hoty + 1) {
      if (*(char *)((long)&id + (long)(int)hoty) == '\0') {
        *(ushort *)&(this->super_FTexture).field_0x31 =
             *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | 8;
        this->PaletteMap[(int)hoty] = '\0';
      }
    }
    break;
  case '\x04':
    *(ushort *)&(this->super_FTexture).field_0x31 =
         *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | 8;
  case '\0':
    if ((*(ushort *)&(this->super_FTexture).field_0x31 >> 4 & 1) == 0) {
      if (((colortype == '\0') && ((this->HaveTrans & 1U) != 0)) &&
         (this->NonPaletteTrans[0] < 0x100)) {
        (this->super_FTexture).field_0x31 = (this->super_FTexture).field_0x31 | 8;
        this->PaletteSize = 0x100;
        pBVar3 = (BYTE *)operator_new__(0x100);
        this->PaletteMap = pBVar3;
        memcpy(this->PaletteMap,FTexture::GrayMap,0x100);
        this->PaletteMap[this->NonPaletteTrans[0]] = '\0';
      }
      else {
        this->PaletteMap = FTexture::GrayMap;
      }
    }
    break;
  case '\x06':
    *(ushort *)&(this->super_FTexture).field_0x31 =
         *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | 8;
  }
  return;
}

Assistant:

FPNGTexture::FPNGTexture (FileReader &lump, int lumpnum, const FString &filename, int width, int height,
						  BYTE depth, BYTE colortype, BYTE interlace)
: FTexture(NULL, lumpnum), SourceFile(filename), Pixels(0), Spans(0),
  BitDepth(depth), ColorType(colortype), Interlace(interlace), HaveTrans(false),
  PaletteMap(0), PaletteSize(0), StartOfIDAT(0)
{
	union
	{
		DWORD palette[256];
		BYTE pngpal[256][3];
	} p;
	BYTE trans[256];
	DWORD len, id;
	int i;

	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = width;
	Height = height;
	CalcBitSize ();

	memset(trans, 255, 256);

	// Parse pre-IDAT chunks. I skip the CRCs. Is that bad?
	lump.Seek(33, SEEK_SET);

	lump.Read(&len, 4);
	lump.Read(&id, 4);
	while (id != MAKE_ID('I','D','A','T') && id != MAKE_ID('I','E','N','D'))
	{
		len = BigLong((unsigned int)len);
		switch (id)
		{
		default:
			lump.Seek (len, SEEK_CUR);
			break;

		case MAKE_ID('g','r','A','b'):
			// This is like GRAB found in an ILBM, except coordinates use 4 bytes
			{
				DWORD hotx, hoty;
				int ihotx, ihoty;
				
				lump.Read(&hotx, 4);
				lump.Read(&hoty, 4);
				ihotx = BigLong((int)hotx);
				ihoty = BigLong((int)hoty);
				if (ihotx < -32768 || ihotx > 32767)
				{
					Printf ("X-Offset for PNG texture %s is bad: %d (0x%08x)\n", Wads.GetLumpFullName (lumpnum), ihotx, ihotx);
					ihotx = 0;
				}
				if (ihoty < -32768 || ihoty > 32767)
				{
					Printf ("Y-Offset for PNG texture %s is bad: %d (0x%08x)\n", Wads.GetLumpFullName (lumpnum), ihoty, ihoty);
					ihoty = 0;
				}
				LeftOffset = ihotx;
				TopOffset = ihoty;
			}
			break;

		case MAKE_ID('P','L','T','E'):
			PaletteSize = MIN<int> (len / 3, 256);
			lump.Read (p.pngpal, PaletteSize * 3);
			if (PaletteSize * 3 != (int)len)
			{
				lump.Seek (len - PaletteSize * 3, SEEK_CUR);
			}
			for (i = PaletteSize - 1; i >= 0; --i)
			{
				p.palette[i] = MAKERGB(p.pngpal[i][0], p.pngpal[i][1], p.pngpal[i][2]);
			}
			break;

		case MAKE_ID('t','R','N','S'):
			lump.Read (trans, len);
			HaveTrans = true;
			// Save for colortype 2
			NonPaletteTrans[0] = WORD(trans[0] * 256 + trans[1]);
			NonPaletteTrans[1] = WORD(trans[2] * 256 + trans[3]);
			NonPaletteTrans[2] = WORD(trans[4] * 256 + trans[5]);
			break;

		case MAKE_ID('a','l','P','h'):
			bAlphaTexture = true;
			bMasked = true;
			break;
		}
		lump.Seek(4, SEEK_CUR);		// Skip CRC
		lump.Read(&len, 4);
		id = MAKE_ID('I','E','N','D');
		lump.Read(&id, 4);
	}
	StartOfIDAT = lump.Tell() - 8;

	switch (colortype)
	{
	case 4:		// Grayscale + Alpha
		bMasked = true;
		// intentional fall-through

	case 0:		// Grayscale
		if (!bAlphaTexture)
		{
			if (colortype == 0 && HaveTrans && NonPaletteTrans[0] < 256)
			{
				bMasked = true;
				PaletteSize = 256;
				PaletteMap = new BYTE[256];
				memcpy (PaletteMap, GrayMap, 256);
				PaletteMap[NonPaletteTrans[0]] = 0;
			}
			else
			{
				PaletteMap = GrayMap;
			}
		}
		break;

	case 3:		// Paletted
		PaletteMap = new BYTE[PaletteSize];
		GPalette.MakeRemap (p.palette, PaletteMap, trans, PaletteSize);
		for (i = 0; i < PaletteSize; ++i)
		{
			if (trans[i] == 0)
			{
				bMasked = true;
				PaletteMap[i] = 0;
			}
		}
		break;

	case 6:		// RGB + Alpha
		bMasked = true;
		break;

	case 2:		// RGB
		bMasked = HaveTrans;
		break;
	}
}